

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Deferred<kj::Function<void_()>_> * __thiscall
kj::PausableReadAsyncIoStream::trackWrite
          (Deferred<kj::Function<void_()>_> *__return_storage_ptr__,PausableReadAsyncIoStream *this)

{
  Iface *pIVar1;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  _kjCondition.value = (bool)(this->currentlyWriting ^ 1);
  if (this->currentlyWriting == false) {
    this->currentlyWriting = true;
    pIVar1 = (Iface *)operator_new(0x10);
    pIVar1->_vptr_Iface = (_func_int **)&PTR_operator___005925a8;
    pIVar1[1]._vptr_Iface = (_func_int **)this;
    f.exception = (Exception *)
                  &kj::_::
                   HeapDisposer<kj::Function<void()>::Impl<kj::PausableReadAsyncIoStream::trackWrite()::$_0>>
                   ::instance;
    (__return_storage_ptr__->maybeFunc).ptr.isSet = true;
    (__return_storage_ptr__->maybeFunc).ptr.field_1.value.impl.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::Function<void()>::Impl<kj::PausableReadAsyncIoStream::trackWrite()::$_0>>
          ::instance;
    (__return_storage_ptr__->maybeFunc).ptr.field_1.value.impl.ptr = pIVar1;
    Own<kj::Function<void_()>::Iface,_std::nullptr_t>::dispose
              ((Own<kj::Function<void_()>::Iface,_std::nullptr_t> *)&f);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[42]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x16d8,FAILED,"!currentlyWriting",
             "_kjCondition,\"only one write is allowed at any one time\"",&_kjCondition,
             (char (*) [42])"only one write is allowed at any one time");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

_::Deferred<kj::Function<void()>> PausableReadAsyncIoStream::trackWrite() {
  KJ_REQUIRE(!currentlyWriting, "only one write is allowed at any one time");
  currentlyWriting = true;
  return kj::defer<kj::Function<void()>>([this]() { currentlyWriting = false; });
}